

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

XMLCh * xercesc_4_0::XMLString::makeUName(XMLCh *pszURI,XMLCh *pszName)

{
  XMLSize_t XVar1;
  XMLSize_t XVar2;
  XMLCh *pXVar3;
  ulong uVar4;
  XMLCh szTmp [2];
  
  XVar1 = stringLen(pszURI);
  if (XVar1 != 0) {
    XVar2 = stringLen(pszName);
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)(XVar2 + XVar1 + 3)) {
      uVar4 = (XVar1 + XVar2) * 2 + 6;
    }
    pXVar3 = (XMLCh *)operator_new__(uVar4);
    copyString(pXVar3,szTmp);
    catString(pXVar3,pszURI);
    catString(pXVar3,szTmp);
    catString(pXVar3,pszName);
    return pXVar3;
  }
  pXVar3 = replicate(pszName,XMLPlatformUtils::fgMemoryManager);
  return pXVar3;
}

Assistant:

XMLCh*
XMLString::makeUName(const XMLCh* const pszURI, const XMLCh* const pszName)
{
    //
    //  If there is a URI, then format out the full name in the {uri}name
    //  form. Otherwise, just set it to the same thing as the base name.
    //
    XMLCh* pszRet = 0;
    const XMLSize_t uriLen = stringLen(pszURI);
    if (uriLen)
    {
        pszRet = new XMLCh[uriLen + stringLen(pszName) + 3];

        XMLCh szTmp[2];
        szTmp[1] = 0;

        szTmp[0] = chOpenCurly;
        copyString(pszRet, szTmp);
        catString(pszRet, pszURI);
        szTmp[0] = chCloseCurly;
        catString(pszRet, szTmp);
        catString(pszRet, pszName);
    }
     else
    {
        pszRet = replicate(pszName);
    }
    return pszRet;
}